

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O3

void writecolourmap(nn_quant *nnq,FILE *f)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  int *piVar5;
  bool bVar6;
  
  uVar1 = (ulong)(uint)nnq->netsize;
  piVar5 = nnq->network[0] + 3;
  lVar3 = 3;
  do {
    if (0 < (int)uVar1) {
      lVar2 = 0;
      piVar4 = piVar5;
      do {
        putc(*piVar4,(FILE *)f);
        lVar2 = lVar2 + 1;
        uVar1 = (ulong)nnq->netsize;
        piVar4 = piVar4 + 5;
      } while (lVar2 < (long)uVar1);
    }
    piVar5 = piVar5 + -1;
    bVar6 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar6);
  return;
}

Assistant:

void writecolourmap(nnq, f)
nn_quant *nnq;
FILE *f;
{
	int i,j;

	for (i=3; i>=0; i--)
		for (j=0; j < nnq->netsize; j++)
			putc(nnq->network[j][i], f);
}